

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::teximage3d_neg_width_height_depth
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar2;
  ContextInfo *this;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_VALUE is generated if width or height is less than 0.",
             &local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x806f,0,0x1908,-1,1,1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x806f,0,0x1908,1,-1,1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x806f,0,0x1908,1,1,-1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x806f,0,0x1908,-1,-1,-1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x8c1a,0,0x1908,-1,1,1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x8c1a,0,0x1908,1,-1,1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x8c1a,0,0x1908,1,1,-1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x8c1a,0,0x1908,-1,-1,-1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  pRVar2 = NegativeTestContext::getRenderContext(local_10);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar1) {
    this = NegativeTestContext::getContextInfo(local_10);
    bVar1 = glu::ContextInfo::isExtensionSupported(this,"GL_OES_texture_cube_map_array");
    if (!bVar1) goto LAB_022bf8ac;
  }
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x9009,0,0x1908,-1,1,6,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x9009,0,0x1908,1,-1,6,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x9009,0,0x1908,1,1,-6,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x9009,0,0x1908,-1,-1,-6,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
LAB_022bf8ac:
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void teximage3d_neg_width_height_depth (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if width or height is less than 0.");
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, -1, 1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, 1, -1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, 1, 1, -1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA, -1, -1, -1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);

	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, -1, 1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 1, -1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 1, 1, -1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, -1, -1, -1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA, -1, 1, 6, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA, 1, -1, 6, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA, 1, 1, -6, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA, -1, -1, -6, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_INVALID_VALUE);
	}
	ctx.endSection();
}